

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delta.cpp
# Opt level: O0

anon_unknown_7 * __thiscall
cpp_client::anon_unknown_7::handle_itr
          (anon_unknown_7 *this,Base_game *context,Delta_mergable *apply_to,ConstMemberIterator *itr
          ,Delta_mergable *owner,
          vector<std::tuple<cpp_client::Delta_mergable_*,_cpp_client::Any_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<cpp_client::Delta_mergable_*,_cpp_client::Any_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *refs,vec_ref_t *vec_refs,string *owner_name)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *other;
  vector<std::tuple<cpp_client::Delta_mergable_*,_cpp_client::Any_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<cpp_client::Delta_mergable_*,_cpp_client::Any_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *owner_00;
  ConstMemberIterator *pCVar1;
  Delta_mergable *pDVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  Pointer pGVar6;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *this_00;
  Ch *pCVar7;
  undefined4 extraout_var;
  ConstMemberIterator CVar8;
  type __lhs;
  mapped_type *this_02;
  Delta_mergable *pDVar9;
  ulong uVar10;
  undefined4 extraout_var_00;
  __shared_ptr<cpp_client::Base_object,_(__gnu_cxx::_Lock_policy)2> *p_Var11;
  undefined4 extraout_var_01;
  __shared_ptr_access<cpp_client::Base_object,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var12;
  element_type *peVar13;
  pointer pAVar14;
  type_info *ptVar15;
  type pAVar16;
  string *psVar17;
  size_type sVar18;
  ostream *poVar19;
  mapped_type *pmVar20;
  Bad_response *this_03;
  allocator local_3ab;
  allocator local_3aa;
  allocator local_3a9;
  shared_ptr<cpp_client::Base_object> local_3a8;
  unique_ptr<cpp_client::Any,_std::default_delete<cpp_client::Any>_> local_398;
  mapped_type *local_390;
  unique_ptr<cpp_client::Any,_std::default_delete<cpp_client::Any>_> local_388;
  anon_unknown_7 local_380 [8];
  string str_4;
  undefined1 local_360 [8];
  shared_ptr<cpp_client::Base_object> self_1;
  shared_ptr<cpp_client::Base_object> local_340;
  unique_ptr<cpp_client::Any,_std::default_delete<cpp_client::Any>_> local_330;
  unique_ptr<cpp_client::Any,_std::default_delete<cpp_client::Any>_> value;
  Any dummy_1;
  Any local_300;
  Any key_1;
  element_type *local_2f0;
  anon_unknown_7 local_2e8 [8];
  string str_3;
  unique_ptr<cpp_client::Any,_std::default_delete<cpp_client::Any>_> local_2c8;
  undefined1 local_2c0 [8];
  shared_ptr<cpp_client::Base_object> self;
  Any local_290;
  Any key;
  Any dummy;
  Base_object *owner2;
  anon_unknown_7 local_270 [8];
  string str_2;
  GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_248;
  ConstMemberIterator name_iter;
  string local_238 [8];
  string target_1;
  GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_210;
  ConstMemberIterator data_iter_2;
  mapped_type *local_200;
  Delta_mergable *local_1f8;
  undefined1 local_1e9;
  Pointer local_1e8;
  mapped_type *local_1e0;
  element_type *local_1d8;
  allocator local_1c9;
  string local_1c8 [8];
  string target;
  anon_unknown_7 local_1a8 [8];
  string str_1;
  GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_180;
  ConstMemberIterator data_iter_1;
  shared_ptr<cpp_client::Base_object> local_158;
  Pointer local_148;
  Base_object *local_140;
  int local_138;
  byte local_131;
  bool add;
  Any to_add;
  anon_unknown_7 local_120 [4];
  int num;
  string str;
  undefined1 local_100 [8];
  shared_ptr<cpp_client::Base_object> ptr;
  GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_e0;
  ConstMemberIterator data_iter;
  vector<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
  temp_refs;
  vector<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
  to_edit;
  int size;
  GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_98;
  ConstMemberIterator id_itr;
  ConstMemberIterator type_itr;
  ConstMemberIterator len_itr;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cpp_client::Base_object>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cpp_client::Base_object>_>_>_>
  *objects;
  allocator local_61;
  string local_60 [8];
  string name;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_> *val
  ;
  vector<std::tuple<cpp_client::Delta_mergable_*,_cpp_client::Any_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<cpp_client::Delta_mergable_*,_cpp_client::Any_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *refs_local;
  Delta_mergable *owner_local;
  ConstMemberIterator *itr_local;
  Delta_mergable *apply_to_local;
  Base_game *context_local;
  string *ref;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cpp_client::Base_object>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cpp_client::Base_object>_>_>_>
  *this_01;
  
  refs_local = (vector<std::tuple<cpp_client::Delta_mergable_*,_cpp_client::Any_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<cpp_client::Delta_mergable_*,_cpp_client::Any_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)owner;
  owner_local = (Delta_mergable *)itr;
  itr_local = (ConstMemberIterator *)apply_to;
  apply_to_local = &context->super_Delta_mergable;
  context_local = (Base_game *)this;
  pGVar6 = rapidjson::
           GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
           ::operator->(itr);
  this_00 = &pGVar6->value;
  pGVar6 = rapidjson::
           GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
           ::operator->((GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         *)owner_local);
  pCVar7 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
           ::GetString(&pGVar6->name);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,pCVar7,&local_61);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  iVar5 = (*apply_to_local->_vptr_Delta_mergable[8])();
  this_01 = (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cpp_client::Base_object>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cpp_client::Base_object>_>_>_>
             *)CONCAT44(extraout_var,iVar5);
  bVar3 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::IsObject(this_00);
  if (bVar3) {
    Base_game::len_string_abi_cxx11_((Base_game *)apply_to_local);
    pCVar7 = (Ch *)std::__cxx11::string::c_str();
    type_itr = rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::FindMember(this_00,pCVar7);
    id_itr = rapidjson::
             GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::FindMember(this_00,"gameObjectName");
    local_98.ptr_ =
         (Pointer)rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::FindMember(this_00,"id");
    CVar8 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::MemberEnd(this_00);
    bVar3 = rapidjson::
            GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::operator!=(&type_itr,(ConstIterator)CVar8.ptr_);
    if (bVar3) {
      pGVar6 = rapidjson::
               GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::operator->(&type_itr);
      iVar5 = attr_wrapper::as<int>(&pGVar6->value);
      (*(code *)(itr_local->ptr_->name).data_.n)(itr_local,local_60,(long)iVar5);
      std::
      vector<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
      ::vector((vector<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                *)&temp_refs.
                   super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::
      vector<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
      ::vector((vector<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                *)&data_iter);
      local_e0.ptr_ =
           (Pointer)rapidjson::
                    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    ::MemberBegin(this_00);
      while( true ) {
        CVar8 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::MemberEnd(this_00);
        bVar3 = rapidjson::
                GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::operator!=(&local_e0,(ConstIterator)CVar8.ptr_);
        if (!bVar3) break;
        ptr.super___shared_ptr<cpp_client::Base_object,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)type_itr.ptr_;
        bVar3 = rapidjson::
                GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::operator==(&local_e0,(ConstIterator)type_itr.ptr_);
        if (!bVar3) {
          pGVar6 = rapidjson::
                   GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   ::operator->(&local_e0);
          bVar3 = rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::IsObject(&pGVar6->value);
          if (bVar3) {
            std::make_shared<cpp_client::Base_object>();
            pDVar2 = apply_to_local;
            pDVar9 = &std::
                      __shared_ptr_access<cpp_client::Base_object,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator*((__shared_ptr_access<cpp_client::Base_object,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_100)->super_Delta_mergable;
            handle_itr(local_120,(Base_game *)pDVar2,pDVar9,&local_e0,(Delta_mergable *)itr_local,
                       refs,vec_refs,(string *)local_60);
            pGVar6 = rapidjson::
                     GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     ::operator->(&local_e0);
            pCVar7 = rapidjson::
                     GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     ::GetString(&pGVar6->name);
            to_add.data_._M_t.
            super___uniq_ptr_impl<cpp_client::Any::holder,_std::default_delete<cpp_client::Any::holder>_>
            ._M_t.
            super__Tuple_impl<0UL,_cpp_client::Any::holder_*,_std::default_delete<cpp_client::Any::holder>_>
            .super__Head_base<0UL,_cpp_client::Any::holder_*,_false>._M_head_impl._4_4_ =
                 atoi(pCVar7);
            uVar10 = std::__cxx11::string::empty();
            if ((uVar10 & 1) == 0) {
              std::
              vector<std::pair<unsigned_long,cpp_client::Any>,std::allocator<std::pair<unsigned_long,cpp_client::Any>>>
              ::emplace_back<int_const&,std::__cxx11::string>
                        ((vector<std::pair<unsigned_long,cpp_client::Any>,std::allocator<std::pair<unsigned_long,cpp_client::Any>>>
                          *)&data_iter,
                         (int *)((long)&to_add.data_._M_t.
                                        super___uniq_ptr_impl<cpp_client::Any::holder,_std::default_delete<cpp_client::Any::holder>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_cpp_client::Any::holder_*,_std::default_delete<cpp_client::Any::holder>_>
                                        .super__Head_base<0UL,_cpp_client::Any::holder_*,_false>.
                                        _M_head_impl + 4),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_120);
            }
            else {
              std::
              vector<std::pair<unsigned_long,cpp_client::Any>,std::allocator<std::pair<unsigned_long,cpp_client::Any>>>
              ::emplace_back<int_const&,std::shared_ptr<cpp_client::Base_object>>
                        ((vector<std::pair<unsigned_long,cpp_client::Any>,std::allocator<std::pair<unsigned_long,cpp_client::Any>>>
                          *)&temp_refs.
                             super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                         (int *)((long)&to_add.data_._M_t.
                                        super___uniq_ptr_impl<cpp_client::Any::holder,_std::default_delete<cpp_client::Any::holder>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_cpp_client::Any::holder_*,_std::default_delete<cpp_client::Any::holder>_>
                                        .super__Head_base<0UL,_cpp_client::Any::holder_*,_false>.
                                        _M_head_impl + 4),
                         (shared_ptr<cpp_client::Base_object> *)local_100);
            }
            std::__cxx11::string::~string((string *)local_120);
            std::shared_ptr<cpp_client::Base_object>::~shared_ptr
                      ((shared_ptr<cpp_client::Base_object> *)local_100);
          }
          else {
            Any::Any((Any *)&stack0xfffffffffffffed0);
            pGVar6 = rapidjson::
                     GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     ::operator->(&local_e0);
            morph_any((Any *)&stack0xfffffffffffffed0,&pGVar6->value);
            local_131 = 1;
            ptVar15 = Any::type((Any *)&stack0xfffffffffffffed0);
            bVar3 = std::type_info::operator==(ptVar15,(type_info *)&std::__cxx11::string::typeinfo)
            ;
            if (bVar3) {
              __lhs = Any::as<std::__cxx11::string>((Any *)&stack0xfffffffffffffed0);
              psVar17 = Base_game::remove_string_abi_cxx11_((Base_game *)apply_to_local);
              local_131 = std::operator!=(__lhs,psVar17);
            }
            if ((local_131 & 1) != 0) {
              pGVar6 = rapidjson::
                       GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       ::operator->(&local_e0);
              pCVar7 = rapidjson::
                       GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       ::GetString(&pGVar6->name);
              local_138 = atoi(pCVar7);
              std::
              vector<std::pair<unsigned_long,cpp_client::Any>,std::allocator<std::pair<unsigned_long,cpp_client::Any>>>
              ::emplace_back<int,cpp_client::Any>
                        ((vector<std::pair<unsigned_long,cpp_client::Any>,std::allocator<std::pair<unsigned_long,cpp_client::Any>>>
                          *)&temp_refs.
                             super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_138,
                         (Any *)&stack0xfffffffffffffed0);
            }
            Any::~Any((Any *)&stack0xfffffffffffffed0);
          }
        }
        rapidjson::
        GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::operator++(&local_e0);
      }
      (**(code **)((long)&(itr_local->ptr_->name).data_ + 8))
                (itr_local,local_60,
                 &temp_refs.
                  super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar3 = std::
              vector<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
              ::empty((vector<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                       *)&data_iter);
      if (!bVar3) {
        local_140 = (Base_object *)itr_local;
        std::
        vector<std::tuple<cpp_client::Base_object*,std::__cxx11::string,std::vector<std::pair<unsigned_long,cpp_client::Any>,std::allocator<std::pair<unsigned_long,cpp_client::Any>>>>,std::allocator<std::tuple<cpp_client::Base_object*,std::__cxx11::string,std::vector<std::pair<unsigned_long,cpp_client::Any>,std::allocator<std::pair<unsigned_long,cpp_client::Any>>>>>>
        ::
        emplace_back<cpp_client::Base_object*,std::__cxx11::string_const&,std::vector<std::pair<unsigned_long,cpp_client::Any>,std::allocator<std::pair<unsigned_long,cpp_client::Any>>>>
                  ((vector<std::tuple<cpp_client::Base_object*,std::__cxx11::string,std::vector<std::pair<unsigned_long,cpp_client::Any>,std::allocator<std::pair<unsigned_long,cpp_client::Any>>>>,std::allocator<std::tuple<cpp_client::Base_object*,std::__cxx11::string,std::vector<std::pair<unsigned_long,cpp_client::Any>,std::allocator<std::pair<unsigned_long,cpp_client::Any>>>>>>
                    *)vec_refs,&local_140,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
                   (vector<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                    *)&data_iter);
      }
      std::
      vector<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
      ::~vector((vector<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                 *)&data_iter);
      std::
      vector<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
      ::~vector((vector<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                 *)&temp_refs.
                    super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    else {
      local_148 = (Pointer)rapidjson::
                           GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                           ::MemberEnd(this_00);
      bVar3 = rapidjson::
              GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::operator!=(&id_itr,(ConstIterator)local_148);
      pDVar2 = apply_to_local;
      if (bVar3) {
        pGVar6 = rapidjson::
                 GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 ::operator->(&id_itr);
        attr_wrapper::as<std::__cxx11::string>((attr_wrapper *)&data_iter_1,&pGVar6->value);
        (*pDVar2->_vptr_Delta_mergable[9])(&local_158,pDVar2,&data_iter_1);
        this_02 = std::
                  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cpp_client::Base_object>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cpp_client::Base_object>_>_>_>
                  ::operator[](this_01,(key_type *)local_60);
        std::shared_ptr<cpp_client::Base_object>::operator=(this_02,&local_158);
        std::shared_ptr<cpp_client::Base_object>::~shared_ptr(&local_158);
        std::__cxx11::string::~string((string *)&data_iter_1);
        local_180.ptr_ =
             (Pointer)rapidjson::
                      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      ::MemberBegin(this_00);
        while( true ) {
          CVar8 = rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::MemberEnd(this_00);
          bVar3 = rapidjson::
                  GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::operator!=(&local_180,(ConstIterator)CVar8.ptr_);
          pDVar2 = apply_to_local;
          if (!bVar3) break;
          p_Var12 = (__shared_ptr_access<cpp_client::Base_object,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)std::
                       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cpp_client::Base_object>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cpp_client::Base_object>_>_>_>
                       ::operator[](this_01,(key_type *)local_60);
          pDVar9 = &std::
                    __shared_ptr_access<cpp_client::Base_object,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator*(p_Var12)->super_Delta_mergable;
          handle_itr(local_1a8,(Base_game *)pDVar2,pDVar9,&local_180,(Delta_mergable *)itr_local,
                     refs,vec_refs,(string *)local_60);
          uVar10 = std::__cxx11::string::empty();
          if ((uVar10 & 1) == 0) {
            pGVar6 = rapidjson::
                     GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     ::operator->(&local_180);
            pCVar7 = rapidjson::
                     GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     ::GetString(&pGVar6->name);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_1c8,pCVar7,&local_1c9);
            std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
            p_Var11 = &std::
                       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cpp_client::Base_object>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cpp_client::Base_object>_>_>_>
                       ::operator[](this_01,(key_type *)local_60)->
                       super___shared_ptr<cpp_client::Base_object,_(__gnu_cxx::_Lock_policy)2>;
            local_1d8 = std::__shared_ptr<cpp_client::Base_object,_(__gnu_cxx::_Lock_policy)2>::get
                                  (p_Var11);
            p_Var12 = (__shared_ptr_access<cpp_client::Base_object,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)std::
                         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cpp_client::Base_object>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cpp_client::Base_object>_>_>_>
                         ::operator[](this_01,(key_type *)local_60);
            peVar13 = std::
                      __shared_ptr_access<cpp_client::Base_object,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->(p_Var12);
            local_1e0 = std::
                        unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>_>_>
                        ::operator[]((peVar13->super_Delta_mergable).variables_,
                                     (key_type *)local_1c8);
            std::
            vector<std::tuple<cpp_client::Delta_mergable*,cpp_client::Any*,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<cpp_client::Delta_mergable*,cpp_client::Any*,std::__cxx11::string,std::__cxx11::string>>>
            ::
            emplace_back<cpp_client::Base_object*,cpp_client::Any*,std::__cxx11::string&,std::__cxx11::string&>
                      ((vector<std::tuple<cpp_client::Delta_mergable*,cpp_client::Any*,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<cpp_client::Delta_mergable*,cpp_client::Any*,std::__cxx11::string,std::__cxx11::string>>>
                        *)refs,&local_1d8,&local_1e0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1c8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1a8);
            std::__cxx11::string::~string(local_1c8);
          }
          std::__cxx11::string::~string((string *)local_1a8);
          rapidjson::
          GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::operator++(&local_180);
        }
      }
      else {
        local_1e8 = (Pointer)rapidjson::
                             GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                             ::MemberEnd(this_00);
        bVar3 = rapidjson::
                GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::operator!=(&local_98,(ConstIterator)local_1e8);
        if (bVar3) {
          local_1e9 = 0;
          pGVar6 = rapidjson::
                   GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   ::operator->(&local_98);
          attr_wrapper::as<std::__cxx11::string>((attr_wrapper *)this,&pGVar6->value);
          uVar10 = std::__cxx11::string::empty();
          if ((uVar10 & 1) != 0) {
            local_1f8 = (Delta_mergable *)itr_local;
            local_200 = std::
                        unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>_>_>
                        ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>_>_>
                                      *)itr_local[2].ptr_,(key_type *)local_60);
            std::
            vector<std::tuple<cpp_client::Delta_mergable*,cpp_client::Any*,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<cpp_client::Delta_mergable*,cpp_client::Any*,std::__cxx11::string,std::__cxx11::string>>>
            ::
            emplace_back<cpp_client::Delta_mergable*,cpp_client::Any*,std::__cxx11::string_const&,std::__cxx11::string_const&>
                      ((vector<std::tuple<cpp_client::Delta_mergable*,cpp_client::Any*,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<cpp_client::Delta_mergable*,cpp_client::Any*,std::__cxx11::string,std::__cxx11::string>>>
                        *)refs,&local_1f8,&local_200,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
          }
          local_1e9 = 1;
          goto LAB_00165e1f;
        }
        local_210.ptr_ =
             (Pointer)rapidjson::
                      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      ::MemberBegin(this_00);
        while( true ) {
          CVar8 = rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::MemberEnd(this_00);
          bVar3 = rapidjson::
                  GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::operator!=(&local_210,(ConstIterator)CVar8.ptr_);
          if (!bVar3) break;
          pGVar6 = rapidjson::
                   GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   ::operator->(&local_210);
          pCVar7 = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   ::GetString(&pGVar6->name);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_238,pCVar7,(allocator *)((long)&name_iter.ptr_ + 7));
          std::allocator<char>::~allocator((allocator<char> *)((long)&name_iter.ptr_ + 7));
          pGVar6 = rapidjson::
                   GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   ::operator->(&local_210);
          bVar3 = rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::IsObject(&pGVar6->value);
          if (bVar3) {
            pGVar6 = rapidjson::
                     GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     ::operator->(&local_210);
            local_248.ptr_ =
                 (Pointer)rapidjson::
                          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                          ::FindMember(&pGVar6->value,"gameObjectName");
            pGVar6 = rapidjson::
                     GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     ::operator->(&local_210);
            CVar8 = rapidjson::
                    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    ::MemberEnd(&pGVar6->value);
            bVar3 = rapidjson::
                    GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    ::operator!=(&local_248,(ConstIterator)CVar8.ptr_);
            if (bVar3) {
              handle_itr(local_270,(Base_game *)apply_to_local,(Delta_mergable *)itr_local,
                         &local_210,(Delta_mergable *)refs_local,refs,vec_refs,owner_name);
              uVar10 = std::__cxx11::string::empty();
              if ((uVar10 & 1) == 0) {
                owner2 = (Base_object *)
                         std::
                         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>_>_>
                         ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>_>_>
                                       *)(refs_local->
                                         super__Vector_base<std::tuple<cpp_client::Delta_mergable_*,_cpp_client::Any_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<cpp_client::Delta_mergable_*,_cpp_client::Any_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_end_of_storage,
                                      (key_type *)local_60);
                std::
                vector<std::tuple<cpp_client::Delta_mergable*,cpp_client::Any*,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<cpp_client::Delta_mergable*,cpp_client::Any*,std::__cxx11::string,std::__cxx11::string>>>
                ::
                emplace_back<cpp_client::Delta_mergable*&,cpp_client::Any*,std::__cxx11::string_const&,std::__cxx11::string>
                          ((vector<std::tuple<cpp_client::Delta_mergable*,cpp_client::Any*,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<cpp_client::Delta_mergable*,cpp_client::Any*,std::__cxx11::string,std::__cxx11::string>>>
                            *)refs,(Delta_mergable **)&refs_local,(Any **)&owner2,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_238,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_270);
              }
              std::__cxx11::string::~string((string *)local_270);
            }
            else {
              bVar4 = (**(code **)((long)&(itr_local->ptr_->value).data_ + 8))(itr_local,local_60);
              owner_00 = refs_local;
              if ((bVar4 & 1) == 0) {
                Any::Any(&key);
                std::__cxx11::string::string
                          ((string *)
                           &self.
                            super___shared_ptr<cpp_client::Base_object,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount,local_60);
                other = &self.
                         super___shared_ptr<cpp_client::Base_object,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount;
                Any::Any<std::__cxx11::string>
                          (&local_290,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           other);
                std::__cxx11::string::~string((string *)other);
                (**(code **)&(((owner_00->
                               super__Vector_base<std::tuple<cpp_client::Delta_mergable_*,_cpp_client::Any_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<cpp_client::Delta_mergable_*,_cpp_client::Any_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start)->
                             super__Tuple_impl<0UL,_cpp_client::Delta_mergable_*,_cpp_client::Any_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             ).
                             super__Tuple_impl<1UL,_cpp_client::Any_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             .
                             super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             .
                             super__Tuple_impl<3UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             .
                             super__Head_base<3UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                             .field_0x18)(&local_2c8,owner_00,owner_name,&local_290,&key);
                std::unique_ptr<cpp_client::Any,_std::default_delete<cpp_client::Any>_>::operator->
                          (&local_2c8);
                Any::get((Any *)local_2c0);
                std::unique_ptr<cpp_client::Any,_std::default_delete<cpp_client::Any>_>::~unique_ptr
                          (&local_2c8);
                pDVar2 = apply_to_local;
                pDVar9 = &std::
                          __shared_ptr_access<cpp_client::Base_object,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          ::operator*((__shared_ptr_access<cpp_client::Base_object,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)local_2c0)->super_Delta_mergable;
                handle_itr(local_2e8,(Base_game *)pDVar2,pDVar9,&local_210,
                           (Delta_mergable *)owner_00,refs,vec_refs,owner_name);
                uVar10 = std::__cxx11::string::empty();
                if ((uVar10 & 1) == 0) {
                  iVar5 = (*apply_to_local->_vptr_Delta_mergable[8])();
                  p_Var11 = &std::
                             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cpp_client::Base_object>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cpp_client::Base_object>_>_>_>
                             ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cpp_client::Base_object>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cpp_client::Base_object>_>_>_>
                                           *)CONCAT44(extraout_var_00,iVar5),(key_type *)local_60)->
                             super___shared_ptr<cpp_client::Base_object,_(__gnu_cxx::_Lock_policy)2>
                  ;
                  local_2f0 = std::__shared_ptr<cpp_client::Base_object,_(__gnu_cxx::_Lock_policy)2>
                              ::get(p_Var11);
                  iVar5 = (*apply_to_local->_vptr_Delta_mergable[8])();
                  p_Var12 = (__shared_ptr_access<cpp_client::Base_object,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)std::
                               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cpp_client::Base_object>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cpp_client::Base_object>_>_>_>
                               ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cpp_client::Base_object>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cpp_client::Base_object>_>_>_>
                                             *)CONCAT44(extraout_var_01,iVar5),(key_type *)local_60)
                  ;
                  peVar13 = std::
                            __shared_ptr_access<cpp_client::Base_object,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            ::operator->(p_Var12);
                  key_1.data_._M_t.
                  super___uniq_ptr_impl<cpp_client::Any::holder,_std::default_delete<cpp_client::Any::holder>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_cpp_client::Any::holder_*,_std::default_delete<cpp_client::Any::holder>_>
                  .super__Head_base<0UL,_cpp_client::Any::holder_*,_false>._M_head_impl =
                       (unique_ptr<cpp_client::Any::holder,_std::default_delete<cpp_client::Any::holder>_>
                        )std::
                         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>_>_>
                         ::operator[]((peVar13->super_Delta_mergable).variables_,
                                      (key_type *)local_238);
                  std::
                  vector<std::tuple<cpp_client::Delta_mergable*,cpp_client::Any*,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<cpp_client::Delta_mergable*,cpp_client::Any*,std::__cxx11::string,std::__cxx11::string>>>
                  ::
                  emplace_back<cpp_client::Base_object*,cpp_client::Any*,std::__cxx11::string_const&,std::__cxx11::string&>
                            ((vector<std::tuple<cpp_client::Delta_mergable*,cpp_client::Any*,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<cpp_client::Delta_mergable*,cpp_client::Any*,std::__cxx11::string,std::__cxx11::string>>>
                              *)refs,&local_2f0,(Any **)&key_1,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_238,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_2e8);
                }
                std::__cxx11::string::~string((string *)local_2e8);
                std::shared_ptr<cpp_client::Base_object>::~shared_ptr
                          ((shared_ptr<cpp_client::Base_object> *)local_2c0);
                Any::~Any(&local_290);
                Any::~Any(&key);
              }
              else {
                std::__cxx11::string::string((string *)&dummy_1,local_238);
                Any::Any<std::__cxx11::string>
                          (&local_300,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &dummy_1);
                std::__cxx11::string::~string((string *)&dummy_1);
                Any::Any((Any *)&value);
                (*(code *)(itr_local->ptr_->value).data_.n)
                          (&local_330,itr_local,local_60,&local_300,&value);
                pAVar14 = std::unique_ptr<cpp_client::Any,_std::default_delete<cpp_client::Any>_>::
                          operator->(&local_330);
                ptVar15 = Any::type(pAVar14);
                bVar3 = std::type_info::operator==
                                  (ptVar15,(type_info *)
                                           &std::shared_ptr<cpp_client::Base_object>::typeinfo);
                if (bVar3) {
                  std::unique_ptr<cpp_client::Any,_std::default_delete<cpp_client::Any>_>::
                  operator->(&local_330);
                  Any::get((Any *)&local_340);
                  bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&local_340);
                  std::shared_ptr<cpp_client::Base_object>::~shared_ptr(&local_340);
                  if (((bVar3 ^ 0xffU) & 1) != 0) {
                    pAVar14 = std::
                              unique_ptr<cpp_client::Any,_std::default_delete<cpp_client::Any>_>::
                              operator->(&local_330);
                    std::make_shared<cpp_client::Base_object>();
                    Any::reset(pAVar14,(shared_ptr<cpp_client::Base_object> *)
                                       &self_1.
                                        super___shared_ptr<cpp_client::Base_object,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount);
                    std::shared_ptr<cpp_client::Base_object>::~shared_ptr
                              ((shared_ptr<cpp_client::Base_object> *)
                               &self_1.
                                super___shared_ptr<cpp_client::Base_object,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount);
                  }
                  std::unique_ptr<cpp_client::Any,_std::default_delete<cpp_client::Any>_>::
                  operator->(&local_330);
                  Any::get((Any *)local_360);
                  pDVar2 = apply_to_local;
                  pDVar9 = &std::
                            __shared_ptr_access<cpp_client::Base_object,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            ::operator*((__shared_ptr_access<cpp_client::Base_object,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                         *)local_360)->super_Delta_mergable;
                  handle_itr(local_380,(Base_game *)pDVar2,pDVar9,&local_210,
                             (Delta_mergable *)itr_local,refs,vec_refs,(string *)local_60);
                  (*(code *)(itr_local->ptr_->value).data_.n)
                            (&local_388,itr_local,local_60,&local_300,&value);
                  std::unique_ptr<cpp_client::Any,_std::default_delete<cpp_client::Any>_>::
                  ~unique_ptr(&local_388);
                  uVar10 = std::__cxx11::string::empty();
                  if ((uVar10 & 1) == 0) {
                    local_390 = std::
                                unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>_>_>
                                ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>_>_>
                                              *)itr_local[2].ptr_,(key_type *)local_60);
                    std::
                    vector<std::tuple<cpp_client::Delta_mergable*,cpp_client::Any*,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<cpp_client::Delta_mergable*,cpp_client::Any*,std::__cxx11::string,std::__cxx11::string>>>
                    ::
                    emplace_back<cpp_client::Delta_mergable*&,cpp_client::Any*,std::__cxx11::string_const&,std::__cxx11::string>
                              ((vector<std::tuple<cpp_client::Delta_mergable*,cpp_client::Any*,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<cpp_client::Delta_mergable*,cpp_client::Any*,std::__cxx11::string,std::__cxx11::string>>>
                                *)refs,(Delta_mergable **)&refs_local,&local_390,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_238,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_380);
                  }
                  std::__cxx11::string::~string((string *)local_380);
                  std::shared_ptr<cpp_client::Base_object>::~shared_ptr
                            ((shared_ptr<cpp_client::Base_object> *)local_360);
                }
                else {
                  pAVar16 = std::unique_ptr<cpp_client::Any,_std::default_delete<cpp_client::Any>_>
                            ::operator*(&local_330);
                  pGVar6 = rapidjson::
                           GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                           ::operator->(&local_210);
                  morph_any(pAVar16,&pGVar6->value);
                  pCVar1 = itr_local;
                  pAVar16 = std::unique_ptr<cpp_client::Any,_std::default_delete<cpp_client::Any>_>
                            ::operator*(&local_330);
                  (*(code *)(pCVar1->ptr_->value).data_.n)
                            (&local_398,pCVar1,local_60,&local_300,pAVar16);
                  std::unique_ptr<cpp_client::Any,_std::default_delete<cpp_client::Any>_>::
                  ~unique_ptr(&local_398);
                }
                std::unique_ptr<cpp_client::Any,_std::default_delete<cpp_client::Any>_>::~unique_ptr
                          (&local_330);
                Any::~Any((Any *)&value);
                Any::~Any(&local_300);
              }
            }
          }
          else {
            pmVar20 = std::
                      unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>_>_>
                      ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>_>_>
                                    *)itr_local[2].ptr_,(key_type *)local_238);
            pGVar6 = rapidjson::
                     GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     ::operator->(&local_210);
            morph_any(pmVar20,&pGVar6->value);
          }
          std::__cxx11::string::~string(local_238);
          rapidjson::
          GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::operator++(&local_210);
        }
      }
    }
  }
  else {
    bVar3 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::IsArray(this_00);
    if (bVar3) {
      this_03 = (Bad_response *)__cxa_allocate_exception(0x10);
      Bad_response::runtime_error(this_03,"Received a JSON array in a delta.");
      __cxa_throw(this_03,&Bad_response::typeinfo,Bad_response::~Bad_response);
    }
    bVar3 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::IsNull(this_00);
    if (bVar3) {
      pmVar20 = std::
                unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>_>_>
                ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>_>_>
                              *)itr_local[2].ptr_,(key_type *)local_60);
      std::shared_ptr<cpp_client::Base_object>::shared_ptr(&local_3a8,(nullptr_t)0x0);
      Any::reset(pmVar20,&local_3a8);
      std::shared_ptr<cpp_client::Base_object>::~shared_ptr(&local_3a8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)this,"",&local_3a9);
      std::allocator<char>::~allocator((allocator<char> *)&local_3a9);
      goto LAB_00165e1f;
    }
    bVar3 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::IsString(this_00);
    if (bVar3) {
      pCVar7 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::GetString(this_00);
      psVar17 = Base_game::remove_string_abi_cxx11_((Base_game *)apply_to_local);
      bVar3 = std::operator==(pCVar7,psVar17);
      if (bVar3) {
        Delta_mergable::erase((Delta_mergable *)refs_local,(string *)local_60);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)this,"",&local_3aa);
        std::allocator<char>::~allocator((allocator<char> *)&local_3aa);
        goto LAB_00165e1f;
      }
    }
    sVar18 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>_>_>
             ::count((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>_>_>
                      *)itr_local[2].ptr_,(key_type *)local_60);
    if ((sVar18 == 0) &&
       (bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_60,"name"), bVar3)) {
      poVar19 = ::operator<<((ostream *)&std::cout,text_yellow);
      poVar19 = std::operator<<(poVar19,"Warning: Unknown variable ");
      poVar19 = std::operator<<(poVar19,local_60);
      poVar19 = std::operator<<(poVar19," added.");
      poVar19 = ::operator<<(poVar19,normal);
      std::operator<<(poVar19,"\n");
    }
    pmVar20 = std::
              unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>_>_>
              ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>_>_>
                            *)itr_local[2].ptr_,(key_type *)local_60);
    morph_any(pmVar20,this_00);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,"",&local_3ab);
  std::allocator<char>::~allocator((allocator<char> *)&local_3ab);
LAB_00165e1f:
  data_iter_2.ptr_._4_4_ = 1;
  std::__cxx11::string::~string(local_60);
  return this;
}

Assistant:

inline std::string
   handle_itr(Base_game& context,
              Delta_mergable& apply_to,
              const rapidjson::Value::ConstMemberIterator& itr,
              Delta_mergable* owner,
              std::vector<std::tuple<Delta_mergable*, Any*, std::string, std::string>>& refs,
              vec_ref_t& vec_refs,
              const std::string& owner_name)
{
   const auto& val = itr->value;
   const auto name = std::string(itr->name.GetString());
   auto& objects = context.get_objects();
   //check if it's an object
   if(val.IsObject())
   {
      //check if it's an "array"
      auto len_itr = val.FindMember(context.len_string().c_str());
      auto type_itr = val.FindMember("gameObjectName");
      auto id_itr = val.FindMember("id");
      if(len_itr != val.MemberEnd())
      {
         //array...
         //grab the length
         auto size = attr_wrapper::as<int>(len_itr->value);
         //resize the vector
         apply_to.resize(name, size);
         std::vector<std::pair<std::size_t, Any>> to_edit;
         std::vector<std::pair<std::size_t, Any>> temp_refs;
         for(auto data_iter = val.MemberBegin(); data_iter != val.MemberEnd(); ++data_iter)
         {
            //skip the length iterator
            if(data_iter == len_itr)
            {
               continue;
            }
            //either a game object or a primitive - if it's an object it's a game object
            if(data_iter->value.IsObject())
            {
               //make a base object and then edit it
               auto ptr = std::make_shared<Base_object>();
               auto str = handle_itr(context,
                                     *ptr,
                                     data_iter,
                                     &apply_to,
                                     refs,
                                     vec_refs,
                                     name);
               const auto num = atoi(data_iter->name.GetString());
               if(!str.empty())
               {
                  temp_refs.emplace_back(num, std::move(str));
               }
               else
               {
                  to_edit.emplace_back(num, std::move(ptr));
               }
            }
            else
            {
               Any to_add;
               morph_any(to_add, data_iter->value);
               bool add = true;
               //if it's the remove state remove ignore it
               if(to_add.type() == typeid(std::string))
               {
                  add = (to_add.as<std::string>() != context.remove_string());
               }
               if(add)
               {
                  to_edit.emplace_back(atoi(data_iter->name.GetString()),
                                       std::move(to_add));
               }
            }
         }
         apply_to.change_vec_values(name, to_edit);
         //put vector object references in there too (if non-empty)
         if(!temp_refs.empty())
         {
            vec_refs.emplace_back(static_cast<Base_object*>(&apply_to),
                                  name,
                                  std::move(temp_refs));
         }
      }
      else if(type_itr != val.MemberEnd())
      {
         //new object...
         //give it a place in the objects
         objects[name] = context.generate_object(attr_wrapper::as<std::string>(type_itr->value));
         for(auto data_iter = val.MemberBegin(); data_iter != val.MemberEnd(); ++data_iter)
         {
            auto str = handle_itr(context,
                                  *objects[name],
                                  data_iter,
                                  &apply_to,
                                  refs,
                                  vec_refs,
                                  name);
            if(!str.empty())
            {
               auto target = std::string{data_iter->name.GetString()};
               refs.emplace_back(objects[name].get(),
                                 &objects[name]->variables_[target],
                                 target,
                                 str);
            }
         }
      }
      else if(id_itr != val.MemberEnd())
      {
         const auto ref = attr_wrapper::as<std::string>(id_itr->value);
         if(owner_name.empty())
         {
            //object reference...
            refs.emplace_back(&apply_to,
                              &apply_to.variables_[name],
                              name,
                              ref);
         }
         return ref;
      }
      else
      {
         //map...
         for(auto data_iter = val.MemberBegin(); data_iter != val.MemberEnd(); ++data_iter)
         {
            const auto target = std::string{data_iter->name.GetString()};
            if(data_iter->value.IsObject())
            {
               //see if it is a new object
               const auto name_iter = data_iter->value.FindMember("gameObjectName");
               if(name_iter != data_iter->value.MemberEnd())
               {
                  auto str = handle_itr(context,
                                        apply_to,
                                        data_iter,
                                        owner,
                                        refs,
                                        vec_refs,
                                        owner_name);
                  if(!str.empty())
                  {
                     refs.emplace_back(owner,
                                       &owner->variables_[name],
                                       target,
                                       std::move(str));
                  }
               }
               else if(!apply_to.is_map(name))
               {
                  auto owner2 = static_cast<Base_object*>(owner);
                  Any dummy;
                  Any key = std::string{name};
                  auto self = owner2->add_key_value(owner_name, key, dummy)->get();
                  auto str = handle_itr(context,
                                        *self,
                                        data_iter,
                                        owner2,
                                        refs,
                                        vec_refs,
                                        owner_name);
                  if(!str.empty())
                  {
                     // str is the id of the object to bind to
                     // target is the field name
                     // name is the id of the object to manipulate
                     refs.emplace_back(context.get_objects()[name].get(),
                                       &context.get_objects()[name]->variables_[target],
                                       target,
                                       str);
                  }
               }
               else
               {
                  //need to handle object references
                  Any key{std::string{target}};
                  Any dummy{};
                  auto value = apply_to.add_key_value(name, key, dummy);
                  if(value->type() == typeid(std::shared_ptr<Base_object>))
                  {
                     //make an object if needed
                     if(!value->get())
                     {
                        value->reset(std::make_shared<Base_object>());
                     }
                     auto self = value->get();
                     auto str = handle_itr(context,
                                           *self,
                                           data_iter,
                                           &apply_to,
                                           refs,
                                           vec_refs,
                                           name);
                     apply_to.add_key_value(name, key, dummy);
                     if(!str.empty())
                     {
                        refs.emplace_back(owner,
                                          &apply_to.variables_[name],
                                          target,
                                          std::move(str));
                     }
                  }
                  else
                  {
                     //otherwise just morph it
                     morph_any(*value, data_iter->value);
                     apply_to.add_key_value(name, key, *value);
                  }
               }
            }
            else
            {
               morph_any(apply_to.variables_[target], data_iter->value);
            }
         }
      }
   }
   else if(!val.IsArray())
   {
      if(val.IsNull())
      {
         apply_to.variables_[name].reset();
         return "";
      }
      else if(val.IsString() && val.GetString() == context.remove_string())
      {
         //remove this thing
         owner->erase(name);
         return "";
      }
      //do some checking (ignore name because of game weirdness)
      if(!apply_to.variables_.count(name) && name != "name")
      {
         std::cout << sgr::text_yellow
                   << "Warning: Unknown variable " << name << " added." << sgr::reset
                   << "\n"
                   ;
      }
      morph_any(apply_to.variables_[name], val);
   }
   else
   {
      //array - some kind of error
      throw Bad_response("Received a JSON array in a delta.");
   }
   return "";
}